

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderIndexingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ShaderIndexingCase::ShaderIndexingCase
          (ShaderIndexingCase *this,Context *context,char *name,char *description,bool isVertexCase,
          DataType varType,ShaderEvalFunc evalFunc,char *vertShaderSource,char *fragShaderSource)

{
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,context->m_testCtx,context->m_renderCtx,
             context->m_contextInfo,name,description,isVertexCase,evalFunc);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderIndexingCase_00c0cf60;
  this->m_varType = varType;
  std::__cxx11::string::assign((char *)&(this->super_ShaderRenderCase).m_vertShaderSource);
  std::__cxx11::string::assign((char *)&(this->super_ShaderRenderCase).m_fragShaderSource);
  return;
}

Assistant:

ShaderIndexingCase::ShaderIndexingCase (Context& context, const char* name, const char* description, bool isVertexCase, DataType varType, ShaderEvalFunc evalFunc, const char* vertShaderSource, const char* fragShaderSource)
	: ShaderRenderCase(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, description, isVertexCase, evalFunc)
{
	m_varType			= varType;
	m_vertShaderSource	= vertShaderSource;
	m_fragShaderSource	= fragShaderSource;
}